

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O0

void read_trip(trip_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  wheelchair_accessible_t wVar2;
  bikes_allowed_t bVar3;
  ulong uVar4;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  trip_t *record_local;
  
  init_trip(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"route_id");
    if (iVar1 == 0) {
      strcpy(record->route_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"service_id");
      if (iVar1 == 0) {
        strcpy(record->service_id,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"trip_id");
        if (iVar1 == 0) {
          strcpy(record->id,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"trip_headsign");
          if (iVar1 == 0) {
            strcpy(record->headsign,field_values[local_2c]);
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"trip_short_name");
            if (iVar1 == 0) {
              strcpy(record->short_name,field_values[local_2c]);
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"direction_id");
              if (iVar1 == 0) {
                uVar4 = strtoul(field_values[local_2c],(char **)0x0,0);
                record->direction_id = (uint)uVar4;
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"block_id");
                if (iVar1 == 0) {
                  strcpy(record->block_id,field_values[local_2c]);
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"shape_id");
                  if (iVar1 == 0) {
                    strcpy(record->shape_id,field_values[local_2c]);
                  }
                  else {
                    iVar1 = strcmp(field_names[local_2c],"wheelchair_accessible");
                    if (iVar1 == 0) {
                      wVar2 = parse_wheelchair_accessibility(field_values[local_2c]);
                      record->wheelchair_accessible = wVar2;
                    }
                    else {
                      iVar1 = strcmp(field_names[local_2c],"bikes_allowed");
                      if (iVar1 == 0) {
                        bVar3 = parse_bike_allowance(field_values[local_2c]);
                        record->bikes_allowed = bVar3;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_trip(trip_t *record, int field_count, const char **field_names, const char **field_values) {
    init_trip(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "route_id") == 0) {
            strcpy(record->route_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_headsign") == 0) {
            strcpy(record->headsign, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_short_name") == 0) {
            strcpy(record->short_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "direction_id") == 0) {
            record->direction_id = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "block_id") == 0) {
            strcpy(record->block_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_id") == 0) {
            strcpy(record->shape_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wheelchair_accessible") == 0) {
            record->wheelchair_accessible = parse_wheelchair_accessibility(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "bikes_allowed") == 0) {
            record->bikes_allowed = parse_bike_allowance(field_values[i]);
            continue;
        }
    }
}